

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingPoint.cpp
# Opt level: O3

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Implementation::FloatComparator<long_double>::operator()
          (FloatComparator<long_double> *this,longdouble actual,longdouble expected)

{
  longdouble lVar1;
  
  if (((actual != expected) || (NAN(actual) || NAN(expected))) && (!NAN(actual) || !NAN(expected)))
  {
    lVar1 = ABS(actual - expected);
    if ((expected != (longdouble)0 && actual != (longdouble)0) && _DAT_00119710 <= lVar1) {
      lVar1 = lVar1 / (ABS(actual) + ABS(expected));
    }
    if (_DAT_00119710 <= lVar1) {
      this->_actualValue = actual;
      this->_expectedValue = expected;
      return (ComparisonStatusFlags)'\x01';
    }
  }
  return (ComparisonStatusFlags)'\0';
}

Assistant:

ComparisonStatusFlags FloatComparator<T>::operator()(T actual, T expected) {
    /* Shortcut for binary equality, infinites and NaN */
    if(actual == expected || (actual != actual && expected != expected))
        return {};

    const T absA = std::abs(actual);
    const T absB = std::abs(expected);
    const T difference = std::abs(actual - expected);

    /* One of the numbers is zero or both are extremely close to it, relative
       error is meaningless */
    if((actual == T{} || expected == T{} || difference < Utility::Implementation::FloatPrecision<T>::epsilon())) {
        if(difference < Utility::Implementation::FloatPrecision<T>::epsilon())
            return {};
    }

    /* Relative error */
    else if(difference/(absA + absB) < Utility::Implementation::FloatPrecision<T>::epsilon())
        return {};

    _actualValue = actual;
    _expectedValue = expected;
    return ComparisonStatusFlag::Failed;
}